

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Obj_t * Abc_BufFindNonBuffDriver(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  
  while( true ) {
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      return pObj;
    }
    iVar1 = Abc_NodeIsBuf(pObj);
    if (iVar1 == 0) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_BufFindNonBuffDriver( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    return (Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj)) ? Abc_BufFindNonBuffDriver(p, Abc_ObjFanin0(pObj)) : pObj;
}